

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaneBasedExecutionQueue.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_342fe3::LaneBasedExecutionQueue::~LaneBasedExecutionQueue
          (LaneBasedExecutionQueue *this)

{
  thread *ptVar1;
  Scheduler *pSVar2;
  int iVar3;
  uint uVar4;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_38;
  
  (this->super_ExecutionQueue)._vptr_ExecutionQueue =
       (_func_int **)&PTR__LaneBasedExecutionQueue_00213880;
  local_38._M_device = &this->readyJobsMutex;
  local_38._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  this->shutdown = true;
  std::condition_variable::notify_all();
  if (local_38._M_owns == true) {
    std::unique_lock<std::mutex>::unlock(&local_38);
  }
  if (this->numLanes != 0) {
    uVar4 = 0;
    do {
      std::thread::join();
      uVar4 = uVar4 + 1;
    } while (uVar4 != this->numLanes);
  }
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->killAfterTimeoutThreadMutex);
  if (iVar3 == 0) {
    if ((this->killAfterTimeoutThread)._M_t.
        super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
        super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
        super__Head_base<0UL,_std::thread_*,_false>._M_head_impl != (thread *)0x0) {
      local_38._M_device = &this->queueCompleteMutex;
      local_38._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_38);
      local_38._M_owns = true;
      this->queueComplete = true;
      std::condition_variable::notify_all();
      if (local_38._M_owns == true) {
        std::unique_lock<std::mutex>::unlock(&local_38);
      }
      std::thread::join();
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->killAfterTimeoutThreadMutex);
    std::condition_variable::~condition_variable(&this->queueCompleteCondition);
    ptVar1 = (this->killAfterTimeoutThread)._M_t.
             super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
             super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
             super__Head_base<0UL,_std::thread_*,_false>._M_head_impl;
    if (ptVar1 != (thread *)0x0) {
      if ((ptVar1->_M_id)._M_thread != 0) {
        std::terminate();
      }
      operator_delete(ptVar1,8);
    }
    (this->killAfterTimeoutThread)._M_t.
    super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
    super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
    super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)0x0;
    llbuild::basic::ProcessGroup::~ProcessGroup(&this->spawnedProcesses);
    std::condition_variable::~condition_variable(&this->readyJobsCondition);
    (this->readyPriorityJobs).super_Scheduler._vptr_Scheduler =
         (_func_int **)&PTR__FifoScheduler_002138f8;
    std::deque<llbuild::basic::QueueJob,_std::allocator<llbuild::basic::QueueJob>_>::~deque
              (&(this->readyPriorityJobs).jobs);
    pSVar2 = (this->readyJobs)._M_t.
             super___uniq_ptr_impl<(anonymous_namespace)::Scheduler,_std::default_delete<(anonymous_namespace)::Scheduler>_>
             ._M_t.
             super__Tuple_impl<0UL,_(anonymous_namespace)::Scheduler_*,_std::default_delete<(anonymous_namespace)::Scheduler>_>
             .super__Head_base<0UL,_(anonymous_namespace)::Scheduler_*,_false>._M_head_impl;
    if (pSVar2 != (Scheduler *)0x0) {
      (*pSVar2->_vptr_Scheduler[1])();
    }
    (this->readyJobs)._M_t.
    super___uniq_ptr_impl<(anonymous_namespace)::Scheduler,_std::default_delete<(anonymous_namespace)::Scheduler>_>
    ._M_t.
    super__Tuple_impl<0UL,_(anonymous_namespace)::Scheduler_*,_std::default_delete<(anonymous_namespace)::Scheduler>_>
    .super__Head_base<0UL,_(anonymous_namespace)::Scheduler_*,_false>._M_head_impl =
         (Scheduler *)0x0;
    std::
    vector<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
    ::~vector(&this->lanes);
    llbuild::basic::ExecutionQueue::~ExecutionQueue(&this->super_ExecutionQueue);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

virtual ~LaneBasedExecutionQueue() {
    // Shut down the lanes.
    {
      std::unique_lock<std::mutex> lock(readyJobsMutex);
      shutdown = true;
      readyJobsCondition.notify_all();
    }

    for (unsigned i = 0; i != numLanes; ++i) {
      lanes[i]->join();
    }

    {
      std::lock_guard<std::mutex> guard(killAfterTimeoutThreadMutex);
      if (killAfterTimeoutThread) {
        {
          std::unique_lock<std::mutex> lock(queueCompleteMutex);
          queueComplete = true;
          queueCompleteCondition.notify_all();
        }
        killAfterTimeoutThread->join();
      }
    }
  }